

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s256_192_1024(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_100 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  iVar5 = 3;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    iVar6 = 0x40;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      auVar9 = vpbroadcastq_avx512vl();
      for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x20) {
        auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)A->w64 + lVar7),auVar9,
                                      *(undefined1 (*) [32])(local_100 + lVar7),0x6a);
        *(undefined1 (*) [32])(local_100 + lVar7) = auVar10;
      }
      A = A + 4;
    }
  }
  for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x20) {
    uVar2 = *(undefined8 *)(local_100 + lVar7 + 8);
    uVar3 = *(undefined8 *)(local_100 + lVar7 + 0x10);
    uVar4 = *(undefined8 *)(local_100 + lVar7 + 0x18);
    puVar1 = (undefined8 *)((long)c->w64 + lVar7);
    *puVar1 = *(undefined8 *)(local_100 + lVar7);
    puVar1[1] = uVar2;
    puVar1[2] = uVar3;
    puVar1[3] = uVar4;
  }
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_192_1024(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[4] = {mm256_zero, mm256_zero, mm256_zero, mm256_zero};
  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1) {
      const word256 mask = mm256_compute_mask(idx, 0);
      for (unsigned int j = 0; j < 4; ++j, ++Ablock) {
        cval[j] = mm256_xor_mask(cval[j], mm256_load(Ablock->w64), mask);
      }
    }
  }

  for (unsigned int j = 0; j < 4; ++j) {
    mm256_store(BLOCK(c, j)->w64, cval[j]);
  }
}